

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O2

ZyanStatus
ZydisFormatterIntelFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanU8 ZVar1;
  ZydisMemoryOperandType ZVar2;
  ZydisRegister ZVar3;
  ZydisRegister ZVar4;
  ZyanStatus ZVar5;
  ZydisDecodedOperand *pZVar6;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,199,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,200,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0xc9,
                  "ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar2 = (context->operand->field_10).mem.type;
  if (((ZVar2 < (ZYDIS_MEMOP_TYPE_MAX_VALUE|ZYDIS_MEMOP_TYPE_MEM)) &&
      ((0x16U >> (ZVar2 & 0x1f) & 1) != 0)) &&
     (ZVar5 = (*formatter->func_print_typecast)(formatter,buffer,context), (int)ZVar5 < 0)) {
    return ZVar5;
  }
  ZVar5 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  if (buffer->is_token_list == '\0') {
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_BEGIN_INTEL);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_BEGIN_INTEL);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
  if (formatter->force_relative_riprel == '\0') {
    pZVar6 = context->operand;
    if (((context->runtime_address == 0xffffffffffffffff) ||
        (*(char *)((long)&pZVar6->field_10 + 0x21) == '\0')) ||
       (((pZVar6->field_10).mem.index != ZYDIS_REGISTER_NONE ||
        ((ZVar3 = (pZVar6->field_10).mem.base, 1 < ZVar3 - ZYDIS_REGISTER_EIP &&
         (ZVar3 != ZYDIS_REGISTER_NONE)))))) goto LAB_00118924;
LAB_001189ed:
    ZVar5 = (*formatter->func_print_address_abs)(formatter,buffer,context);
  }
  else {
    pZVar6 = context->operand;
LAB_00118924:
    ZVar3 = (pZVar6->field_10).mem.base;
    ZVar4 = (pZVar6->field_10).mem.index;
    if ((ZVar3 != ZYDIS_REGISTER_NONE) &&
       (ZVar5 = (*formatter->func_print_register)(formatter,buffer,context,ZVar3), (int)ZVar5 < 0))
    {
      return ZVar5;
    }
    if (ZVar4 != ZYDIS_REGISTER_NONE) {
      if ((context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE) {
        if (buffer->is_token_list == '\0') {
          ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_ADD);
        }
        else {
          ZVar5 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_ADD)
          ;
        }
        if ((int)ZVar5 < 0) {
          return ZVar5;
        }
      }
      ZVar5 = (*formatter->func_print_register)
                        (formatter,buffer,context,(context->operand->field_10).mem.index);
      if ((int)ZVar5 < 0) {
        return ZVar5;
      }
      ZVar1 = (context->operand->field_10).mem.scale;
      if (((ZVar1 != '\0') && ((context->operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)) &&
         ((ZVar1 != '\x01' || (formatter->force_memory_scale != '\0')))) {
        if (buffer->is_token_list == '\0') {
          ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_MUL);
        }
        else {
          ZVar5 = ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_MUL)
          ;
        }
        if ((int)ZVar5 < 0) {
          return ZVar5;
        }
        if ((buffer->is_token_list != '\0') &&
           (ZVar5 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar5 < 0)) {
          return ZVar5;
        }
        ZVar5 = ZydisStringAppendDecU
                          (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                           (ZyanStringView *)0x0,(ZyanStringView *)0x0);
        if ((int)ZVar5 < 0) {
          return ZVar5;
        }
      }
    }
    if (ZVar3 == ZYDIS_REGISTER_NONE && ZVar4 == ZYDIS_REGISTER_NONE) goto LAB_001189ed;
    if ((*(char *)((long)&context->operand->field_10 + 0x21) == '\0') ||
       ((context->operand->field_10).mem.disp.value == 0)) goto LAB_00118a24;
    ZVar5 = (*formatter->func_print_disp)(formatter,buffer,context);
  }
  if ((int)ZVar5 < 0) {
    return ZVar5;
  }
LAB_00118a24:
  if (buffer->is_token_list == '\0') {
    ZVar5 = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_END_INTEL);
  }
  else {
    ZVar5 = ZydisFormatterBufferAppendPredefined
                      (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_END_INTEL);
  }
  if (-1 < (int)ZVar5) {
    ZVar5 = 0x100000;
  }
  return ZVar5;
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    if ((context->operand->mem.type == ZYDIS_MEMOP_TYPE_MEM) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN) ||
        (context->operand->mem.type == ZYDIS_MEMOP_TYPE_VSIB))
    {
        ZYAN_CHECK(formatter->func_print_typecast(formatter, buffer, context));
    }
    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_INTEL);

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            if (context->operand->mem.base != ZYDIS_REGISTER_NONE)
            {
                ZYDIS_BUFFER_APPEND(buffer, ADD);
            }
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND(buffer, MUL);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }
    }

    ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_INTEL);
    return ZYAN_STATUS_SUCCESS;
}